

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

char * TargetPropertyNode::GetErrorText(string *targetName,string *propertyName)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  string *propertyName_local;
  string *targetName_local;
  
  if ((GetErrorText(std::__cxx11::string_const&,std::__cxx11::string_const&)::propertyNameValidator
       == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetErrorText(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::propertyNameValidator), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&GetErrorText::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetErrorText::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&GetErrorText(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         propertyNameValidator);
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      bVar1 = cmGeneratorExpression::IsValidTargetName(targetName);
      if (bVar1) {
        targetName_local = (string *)0x0;
      }
      else {
        bVar1 = cmsys::RegularExpression::find(&GetErrorText::propertyNameValidator,propertyName);
        if (bVar1) {
          targetName_local = (string *)anon_var_dwarf_15be001;
        }
        else {
          targetName_local = (string *)anon_var_dwarf_15bdfe6;
        }
      }
    }
    else {
      targetName_local = (string *)anon_var_dwarf_15bdfcb;
    }
  }
  else {
    targetName_local = (string *)anon_var_dwarf_15bdfb0;
  }
  return (char *)targetName_local;
}

Assistant:

static const char* GetErrorText(std::string const& targetName,
                                  std::string const& propertyName)
  {
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");
    if (targetName.empty() && propertyName.empty()) {
      return "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
             "target name and property name.";
    }
    if (targetName.empty()) {
      return "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
             "target name.";
    }
    if (!cmGeneratorExpression::IsValidTargetName(targetName)) {
      if (!propertyNameValidator.find(propertyName)) {
        return "Target name and property name not supported.";
      }
      return "Target name not supported.";
    }
    return nullptr;
  }